

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

uint64_t __thiscall rcg::Device::getTimestampFrequency(Device *this)

{
  mutex *__mutex;
  PIFGetDeviceInfo p_Var1;
  Interface *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint64_t uVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R15;
  uint64_t freq;
  INFO_DATATYPE type;
  size_t size;
  uint64_t local_38;
  INFO_DATATYPE local_2c;
  size_t local_28;
  
  __mutex = &this->mtx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    local_38 = 0;
    local_28 = 8;
    if (this->dev == (DEV_HANDLE)0x0) {
      pvVar4 = Interface::getHandle
                         ((this->parent).
                          super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (pvVar4 != (void *)0x0) {
        p_Var1 = ((this->gentl).
                  super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 IFGetDeviceInfo;
        this_00 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_01 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        pvVar4 = Interface::getHandle(this_00);
        (*p_Var1)(pvVar4,(this->id)._M_dataplus._M_p,9,&local_2c,&local_38,&local_28);
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
    else {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DevGetInfo)(this->dev,9,&local_2c,&local_38,&local_28);
    }
    uVar2 = local_38;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return uVar2;
  }
  uVar5 = std::__throw_system_error(iVar3);
  if (unaff_R15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R15);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar5);
}

Assistant:

uint64_t Device::getTimestampFrequency()
{
  std::lock_guard<std::mutex> lock(mtx);
  GenTL::INFO_DATATYPE type;
  uint64_t freq=0;
  size_t size=sizeof(freq);

  if (dev != 0)
  {
    gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }
  else if (parent->getHandle() != 0)
  {
    gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                           GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }

  return freq;
}